

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegRangePtr
xmlRegNewRange(xmlRegParserCtxtPtr ctxt,int neg,xmlRegAtomType type,int start,int end)

{
  xmlRegRangePtr ret;
  int end_local;
  int start_local;
  xmlRegAtomType type_local;
  int neg_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlRegParserCtxtPtr)(*xmlMalloc)(0x18);
  if (ctxt_local == (xmlRegParserCtxtPtr)0x0) {
    xmlRegexpErrMemory(ctxt);
    ctxt_local = (xmlRegParserCtxtPtr)0x0;
  }
  else {
    *(int *)&ctxt_local->string = neg;
    *(xmlRegAtomType *)((long)&ctxt_local->string + 4) = type;
    *(int *)&ctxt_local->cur = start;
    *(int *)((long)&ctxt_local->cur + 4) = end;
  }
  return (xmlRegRangePtr)ctxt_local;
}

Assistant:

static xmlRegRangePtr
xmlRegNewRange(xmlRegParserCtxtPtr ctxt,
	       int neg, xmlRegAtomType type, int start, int end) {
    xmlRegRangePtr ret;

    ret = (xmlRegRangePtr) xmlMalloc(sizeof(xmlRegRange));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt);
	return(NULL);
    }
    ret->neg = neg;
    ret->type = type;
    ret->start = start;
    ret->end = end;
    return(ret);
}